

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O0

int libtorrent::unchoke_sort
              (vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               *peers,int max_upload_rate,time_duration unchoke_interval,session_settings *sett)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pppVar4;
  int64_t iVar5;
  int64_t iVar6;
  size_type sVar7;
  int *piVar8;
  code *local_200;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>
  local_1f8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_1e8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_1e0;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_1d8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_1d0;
  int local_1c4;
  code *pcStack_1c0;
  int pieces_1;
  type local_1b8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_1a8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_1a0;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_198;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_190;
  _func_bool_peer_connection_ptr_peer_connection_ptr *local_188;
  type local_180;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_170;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_168;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_160;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_158;
  code *local_150;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>
  local_148;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_138;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_130;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_128;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_120;
  int local_114;
  int local_110;
  int pieces;
  time_duration tStack_108;
  int slots;
  int local_fc;
  peer_connection *ppStack_f8;
  int rate;
  peer_connection *p_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *__range2_2;
  code *pcStack_d0;
  int rate_threshold;
  type local_c8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_b8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_b0;
  int local_a4;
  peer_connection *ppStack_a0;
  int upload_slots;
  peer_connection *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *__range2_1;
  int upload_slots_1;
  int upload_capacity_left;
  type local_70;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_60;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  local_58;
  peer_connection *local_50;
  peer_connection *p;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *__range2;
  session_settings *sett_local;
  int max_upload_rate_local;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *peers_local
  ;
  time_duration unchoke_interval_local;
  
  iVar2 = aux::session_settings::get_int(sett,0x401f);
  if (iVar2 == 3) {
    __end2 = std::
             vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
             begin(peers);
    p = (peer_connection *)
        std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
        end(peers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                                       *)&p), bVar1) {
      pppVar4 = __gnu_cxx::
                __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                ::operator*(&__end2);
      local_50 = *pppVar4;
      uVar3 = (*(local_50->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
      if (((uVar3 & 1) == 0) && (bVar1 = peer_connection::is_interesting(local_50), bVar1)) {
        bVar1 = peer_connection::has_peer_choked(local_50);
        if (bVar1) {
          peer_connection::increase_est_reciprocation_rate(local_50);
        }
        else {
          peer_connection::decrease_est_reciprocation_rate(local_50);
        }
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
      ::operator++(&__end2);
    }
    local_58._M_current =
         (peer_connection **)
         std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         ::begin(peers);
    local_60._M_current =
         (peer_connection **)
         std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         ::end(peers);
    _upload_slots_1 = anon_unknown_8::bittyrant_unchoke_compare;
    std::
    bind<bool(*)(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*),std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              (&local_70,(_func_bool_peer_connection_ptr_peer_connection_ptr **)&upload_slots_1,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    std::
    sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
              (local_58,local_60,&local_70);
    __range2_1._0_4_ = 0;
    __end2_1 = std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::begin(peers);
    p_1 = (peer_connection *)
          std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
          ::end(peers);
    __range2_1._4_4_ = max_upload_rate;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                               *)&p_1), bVar1) {
      pppVar4 = __gnu_cxx::
                __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                ::operator*(&__end2_1);
      ppStack_a0 = *pppVar4;
      iVar2 = peer_connection::est_reciprocation_rate(ppStack_a0);
      if (__range2_1._4_4_ < iVar2) break;
      __range2_1._0_4_ = (int)__range2_1 + 1;
      iVar2 = peer_connection::est_reciprocation_rate(ppStack_a0);
      __range2_1._4_4_ = __range2_1._4_4_ - iVar2;
      __gnu_cxx::
      __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
      ::operator++(&__end2_1);
    }
    unchoke_interval_local.__r._4_4_ = (int)__range2_1;
  }
  else {
    local_a4 = aux::session_settings::get_int(sett,0x4053);
    if (local_a4 < 0) {
      local_a4 = std::numeric_limits<int>::max();
    }
    iVar2 = aux::session_settings::get_int(sett,0x401f);
    if (iVar2 == 2) {
      local_a4 = 0;
      local_b0._M_current =
           (peer_connection **)
           std::
           vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
           begin(peers);
      local_b8._M_current =
           (peer_connection **)
           std::
           vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
           end(peers);
      pcStack_d0 = anon_unknown_8::upload_rate_compare;
      std::
      bind<bool(*)(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*),std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                (&local_c8,&stack0xffffffffffffff30,(_Placeholder<1> *)&std::placeholders::_1,
                 (_Placeholder<2> *)&std::placeholders::_2);
      std::
      sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
                (local_b0,local_b8,&local_c8);
      __range2_2._4_4_ = 0x400;
      __end2_2 = std::
                 vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                 ::begin(peers);
      p_2 = (peer_connection *)
            std::
            vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
            end(peers);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                                 *)&p_2), bVar1) {
        pppVar4 = __gnu_cxx::
                  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                  ::operator*(&__end2_2);
        ppStack_f8 = *pppVar4;
        iVar5 = peer_connection::uploaded_in_last_round(ppStack_f8);
        tStack_108.__r = unchoke_interval.__r;
        iVar6 = total_milliseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)unchoke_interval.__r);
        local_fc = (int)((iVar5 * 1000) / iVar6);
        if (local_fc < __range2_2._4_4_) break;
        local_a4 = local_a4 + 1;
        __range2_2._4_4_ = __range2_2._4_4_ + 0x400;
        __gnu_cxx::
        __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
        ::operator++(&__end2_2);
      }
      local_a4 = local_a4 + 1;
    }
    sVar7 = std::
            vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
            size(peers);
    local_110 = (int)sVar7;
    piVar8 = std::min<int>(&local_a4,&local_110);
    pieces = *piVar8;
    iVar2 = aux::session_settings::get_int(sett,0x4020);
    if (iVar2 == 0) {
      local_114 = aux::session_settings::get_int(sett,0x4039);
      local_120._M_current =
           (peer_connection **)
           std::
           vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
           begin(peers);
      local_130._M_current =
           (peer_connection **)
           std::
           vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
           begin(peers);
      local_128 = __gnu_cxx::
                  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                  ::operator+(&local_130,(long)pieces);
      local_138._M_current =
           (peer_connection **)
           std::
           vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
           end(peers);
      local_150 = anon_unknown_8::unchoke_compare_rr;
      std::
      bind<bool(*)(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int),std::_Placeholder<1>const&,std::_Placeholder<2>const&,int_const&>
                (&local_148._M_f,(_Placeholder<1> *)&local_150,
                 (_Placeholder<2> *)&std::placeholders::_1,(int *)&std::placeholders::_2);
      std::
      nth_element<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int)>>
                (local_120,local_128,local_138,&local_148);
    }
    else {
      iVar2 = aux::session_settings::get_int(sett,0x4020);
      if (iVar2 == 1) {
        local_158._M_current =
             (peer_connection **)
             std::
             vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
             begin(peers);
        local_168._M_current =
             (peer_connection **)
             std::
             vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
             begin(peers);
        local_160 = __gnu_cxx::
                    __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                    ::operator+(&local_168,(long)pieces);
        local_170._M_current =
             (peer_connection **)
             std::
             vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>::
             end(peers);
        local_188 = anon_unknown_8::unchoke_compare_fastest_upload;
        std::
        bind<bool(*)(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*),std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                  (&local_180,&local_188,(_Placeholder<1> *)&std::placeholders::_1,
                   (_Placeholder<2> *)&std::placeholders::_2);
        std::
        nth_element<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
                  (local_158,local_160,local_170,&local_180);
      }
      else {
        iVar2 = aux::session_settings::get_int(sett,0x4020);
        if (iVar2 == 2) {
          local_190._M_current =
               (peer_connection **)
               std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::begin(peers);
          local_1a0._M_current =
               (peer_connection **)
               std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::begin(peers);
          local_198 = __gnu_cxx::
                      __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                      ::operator+(&local_1a0,(long)pieces);
          local_1a8._M_current =
               (peer_connection **)
               std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::end(peers);
          pcStack_1c0 = anon_unknown_8::unchoke_compare_anti_leech;
          std::
          bind<bool(*)(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*),std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                    (&local_1b8,&stack0xfffffffffffffe40,(_Placeholder<1> *)&std::placeholders::_1,
                     (_Placeholder<2> *)&std::placeholders::_2);
          std::
          nth_element<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
                    (local_190,local_198,local_1a8,&local_1b8);
        }
        else {
          local_1c4 = aux::session_settings::get_int(sett,0x4039);
          local_1d0._M_current =
               (peer_connection **)
               std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::begin(peers);
          local_1e0._M_current =
               (peer_connection **)
               std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::begin(peers);
          local_1d8 = __gnu_cxx::
                      __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                      ::operator+(&local_1e0,(long)pieces);
          local_1e8._M_current =
               (peer_connection **)
               std::
               vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               ::end(peers);
          local_200 = anon_unknown_8::unchoke_compare_rr;
          std::
          bind<bool(*)(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int),std::_Placeholder<1>const&,std::_Placeholder<2>const&,int_const&>
                    (&local_1f8._M_f,(_Placeholder<1> *)&local_200,
                     (_Placeholder<2> *)&std::placeholders::_1,(int *)&std::placeholders::_2);
          std::
          nth_element<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int)>>
                    (local_1d0,local_1d8,local_1e8,&local_1f8);
        }
      }
    }
    unchoke_interval_local.__r._4_4_ = local_a4;
  }
  return unchoke_interval_local.__r._4_4_;
}

Assistant:

int unchoke_sort(std::vector<peer_connection*>& peers
		, int const max_upload_rate
		, time_duration const unchoke_interval
		, aux::session_settings const& sett)
	{
#if TORRENT_USE_ASSERTS
		for (auto p : peers)
		{
			TORRENT_ASSERT(p->self());
			TORRENT_ASSERT(p->associated_torrent().lock());
		}
#endif

#if TORRENT_ABI_VERSION == 1
		// ==== BitTyrant ====
		//
		// if we're using the bittyrant unchoker, go through all peers that
		// we have unchoked already, and adjust our estimated reciprocation
		// rate. If the peer has reciprocated, lower the estimate, if it hasn't,
		// increase the estimate (this attempts to optimize "ROI" of upload
		// capacity, by sending just enough to be reciprocated).
		// For more information, see: http://bittyrant.cs.washington.edu/
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::bittyrant_choker)
		{
			for (auto const p : peers)
			{
				if (p->is_choked() || !p->is_interesting()) continue;

				if (!p->has_peer_choked())
				{
					// we're unchoked, we may want to lower our estimated
					// reciprocation rate
					p->decrease_est_reciprocation_rate();
				}
				else
				{
					// we've unchoked this peer, and it hasn't reciprocated
					// we may want to increase our estimated reciprocation rate
					p->increase_est_reciprocation_rate();
				}
			}

			// if we're using the bittyrant choker, sort peers by their return
			// on investment. i.e. download rate / upload rate
			// TODO: use an incremental partial_sort() here
			std::sort(peers.begin(), peers.end()
				, std::bind(&bittyrant_unchoke_compare, _1, _2));

			int upload_capacity_left = max_upload_rate;

			// now, figure out how many peers should be unchoked. We deduct the
			// estimated reciprocation rate from our upload_capacity estimate
			// until there none left
			int upload_slots = 0;

			for (auto const p : peers)
			{
				TORRENT_ASSERT(p != nullptr);

				if (p->est_reciprocation_rate() > upload_capacity_left) break;

				++upload_slots;
				upload_capacity_left -= p->est_reciprocation_rate();
			}

			return upload_slots;
		}
#else
		TORRENT_UNUSED(max_upload_rate);
#endif

		int upload_slots = sett.get_int(settings_pack::unchoke_slots_limit);
		if (upload_slots < 0)
			upload_slots = std::numeric_limits<int>::max();

		// ==== rate-based ====
		//
		// The rate based unchoker looks at our upload rate to peers, and find
		// a balance between number of upload slots and the rate we achieve. The
		// intention is to not spread upload bandwidth too thin, but also to not
		// unchoke few enough peers to not be able to saturate the up-link.
		// this is done by traversing the peers sorted by our upload rate to
		// them in decreasing rates. For each peer we increase our threshold
		// by 1 kB/s. The first peer we get to whom we upload slower than
		// the threshold, we stop and that's the number of unchoke slots we have.
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::rate_based_choker)
		{
			// first reset the number of unchoke slots, because we'll calculate
			// it purely based on the current state of our peers.
			upload_slots = 0;

			// TODO: use an incremental partial_sort() here. We don't need
			// to sort the entire list

			// TODO: make the comparison function a free function and move it
			// into this cpp file
			std::sort(peers.begin(), peers.end()
				, std::bind(&upload_rate_compare, _1, _2));

			// TODO: make configurable
			int rate_threshold = 1024;

			for (auto const p : peers)
			{
				int const rate = int(p->uploaded_in_last_round()
					* 1000 / total_milliseconds(unchoke_interval));

				if (rate < rate_threshold) break;

				++upload_slots;

				// TODO: make configurable
				rate_threshold += 1024;
			}
			++upload_slots;
		}

		// sorts the peers that are eligible for unchoke by download rate and
		// secondary by total upload. The reason for this is, if all torrents are
		// being seeded, the download rate will be 0, and the peers we have sent
		// the least to should be unchoked

		// we use partial sort here, because we only care about the top
		// upload_slots peers.

		int const slots = std::min(upload_slots, int(peers.size()));

		if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::round_robin)
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);

			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::fastest_upload)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_fastest_upload, _1, _2));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::anti_leech)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_anti_leech, _1, _2));
		}
		else
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));

			TORRENT_ASSERT_FAIL();
		}

		return upload_slots;
	}